

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_stats.cpp
# Opt level: O2

BaseStatistics *
duckdb::NumericStats::CreateEmpty(BaseStatistics *__return_storage_ptr__,LogicalType *type)

{
  Value VStack_68;
  LogicalType local_28;
  
  LogicalType::LogicalType(&local_28,type);
  BaseStatistics::BaseStatistics(__return_storage_ptr__,&local_28);
  LogicalType::~LogicalType(&local_28);
  __return_storage_ptr__->has_null = false;
  __return_storage_ptr__->has_no_null = true;
  Value::MaximumValue(&VStack_68,&__return_storage_ptr__->type);
  SetMin(__return_storage_ptr__,&VStack_68);
  Value::~Value(&VStack_68);
  Value::MinimumValue(&VStack_68,&__return_storage_ptr__->type);
  SetMax(__return_storage_ptr__,&VStack_68);
  Value::~Value(&VStack_68);
  return __return_storage_ptr__;
}

Assistant:

BaseStatistics NumericStats::CreateEmpty(LogicalType type) {
	BaseStatistics result(std::move(type));
	result.InitializeEmpty();
	SetMin(result, Value::MaximumValue(result.GetType()));
	SetMax(result, Value::MinimumValue(result.GetType()));
	return result;
}